

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O3

void duckdb::PushCollations
               (ClientContext *context,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children,CollationType type)

{
  LogicalType *this;
  pointer puVar1;
  bool bVar2;
  pointer pEVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *arg;
  pointer this_00;
  LogicalType collation_type;
  string collation;
  LogicalType local_88;
  string local_70;
  string local_50;
  
  ExtractCollation_abi_cxx11_(&local_70,(duckdb *)children,children);
  if (local_70._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      local_50.field_2._8_8_ = local_70.field_2._8_8_;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    }
    local_50._M_string_length = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    LogicalType::VARCHAR_COLLATION(&local_88,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((bound_function->super_BaseScalarFunction).return_type.id_ == VARCHAR) {
      this = &(bound_function->super_BaseScalarFunction).return_type;
      bVar2 = LogicalType::HasAlias(this);
      if (this != &local_88 && !bVar2) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = local_88.id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             local_88.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &local_88.type_info_);
      }
    }
    this_00 = (children->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (children->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != puVar1) {
      do {
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        if ((pEVar3->return_type).id_ == VARCHAR) {
          bVar2 = LogicalType::HasAlias(&pEVar3->return_type);
          if (!bVar2) {
            pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_00);
            if (&pEVar3->return_type != &local_88) {
              (pEVar3->return_type).id_ = local_88.id_;
              (pEVar3->return_type).physical_type_ = local_88.physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&(pEVar3->return_type).type_info_,&local_88.type_info_);
            }
          }
        }
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        ExpressionBinder::PushCollation(context,this_00,&pEVar3->return_type,type);
        this_00 = this_00 + 1;
      } while (this_00 != puVar1);
    }
    LogicalType::~LogicalType(&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PushCollations(ClientContext &context, ScalarFunction &bound_function, vector<unique_ptr<Expression>> &children,
                    CollationType type) {
	auto collation = ExtractCollation(children);
	if (collation.empty()) {
		// no collation to push
		return;
	}
	// push collation into the return type if required
	auto collation_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
	if (RequiresCollationPropagation(bound_function.return_type)) {
		bound_function.return_type = collation_type;
	}
	// push collations to the children
	for (auto &arg : children) {
		if (RequiresCollationPropagation(arg->return_type)) {
			// if this is a varchar type - propagate the collation
			arg->return_type = collation_type;
		}
		// now push the actual collation handling
		ExpressionBinder::PushCollation(context, arg, arg->return_type, type);
	}
}